

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

matrix sptk::swipe::zerom(int xSz,int ySz)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  matrix mVar5;
  
  ppdVar1 = (double **)malloc((long)xSz * 8);
  uVar4 = 0;
  uVar3 = 0;
  if (0 < xSz) {
    uVar3 = (ulong)(uint)xSz;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    pdVar2 = (double *)calloc(8,(long)ySz);
    ppdVar1[uVar4] = pdVar2;
  }
  mVar5.y = ySz;
  mVar5.x = xSz;
  mVar5.m = ppdVar1;
  return mVar5;
}

Assistant:

matrix zerom(int xSz, int ySz) {
    matrix nw_matrix;
    nw_matrix.x = xSz;
    nw_matrix.y = ySz;
#if 0
    nw_matrix.m = malloc(sizeof(double*) * xSz);
#else
    nw_matrix.m = (double**) malloc(sizeof(double*) * xSz);
#endif
    int i;
    for (i = 0; i < nw_matrix.x; i++)
#if 0
        nw_matrix.m[i] = calloc(sizeof(double), ySz);
#else
        nw_matrix.m[i] = (double*) calloc(sizeof(double), ySz);
#endif
    return(nw_matrix);
}